

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

int ov_pcm_seek(OggVorbis_File *vf,ogg_int64_t pos)

{
  ogg_stream_state *os;
  vorbis_dsp_state *v;
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ogg_int64_t oVar5;
  byte bVar6;
  int readp;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ogg_page og;
  ogg_packet op;
  
  iVar2 = ov_pcm_seek_page(vf,pos);
  if ((iVar2 < 0) || (iVar2 = _make_decode_ready(vf), iVar2 != 0)) {
    return iVar2;
  }
  os = &vf->os;
  v = &vf->vd;
  iVar2 = 0;
LAB_0018fb45:
  while( true ) {
    iVar3 = ogg_stream_packetpeek(os,&op);
    if (iVar3 < 1) break;
    lVar4 = vorbis_packet_blocksize(vf->vi + vf->current_link,&op);
    iVar3 = (int)lVar4;
    if (iVar3 < 0) {
      ogg_stream_packetout(os,(ogg_packet *)0x0);
    }
    else {
      lVar4 = vf->pcm_offset;
      if (iVar2 != 0) {
        lVar4 = lVar4 + (ulong)((uint)(iVar2 + iVar3) >> 2);
        vf->pcm_offset = lVar4;
      }
      iVar2 = vorbis_info_blocksize(vf->vi,1);
      if (pos <= (iVar2 + iVar3 >> 2) + lVar4) {
LAB_0018fd23:
        vf->bittrack = 0.0;
        vf->samptrack = 0.0;
        iVar2 = vorbis_synthesis_halfrate_p(vf->vi);
        bVar6 = (byte)iVar2;
        while (vf->pcm_offset < (long)(((ulong)pos >> (bVar6 & 0x3f)) << (bVar6 & 0x3f))) {
          lVar10 = pos - vf->pcm_offset >> (bVar6 & 0x3f);
          iVar3 = vorbis_synthesis_pcmout(v,(float ***)0x0);
          lVar8 = (long)iVar3;
          lVar4 = lVar8;
          if (lVar10 < lVar8) {
            lVar4 = lVar10;
          }
          vorbis_synthesis_read(v,(int)lVar4);
          vf->pcm_offset = vf->pcm_offset + (lVar4 << (bVar6 & 0x3f));
          if ((lVar8 < lVar10) &&
             (iVar3 = _fetch_and_process_packet(vf,(ogg_packet *)0x1,readp,iVar2), iVar3 < 1)) {
            oVar5 = ov_pcm_total(vf,-1);
            vf->pcm_offset = oVar5;
          }
        }
        return 0;
      }
      ogg_stream_packetout(os,(ogg_packet *)0x0);
      vorbis_synthesis_trackonly(&vf->vb,&op);
      vorbis_synthesis_blockin(v,&vf->vb);
      iVar2 = iVar3;
      if (-1 < op.granulepos) {
        uVar1 = vf->current_link;
        lVar4 = op.granulepos - vf->pcmlengths[(long)(int)uVar1 * 2];
        if (lVar4 < 1) {
          lVar4 = 0;
        }
        vf->pcm_offset = lVar4;
        uVar7 = 0;
        if (0 < (int)uVar1) {
          uVar7 = (ulong)uVar1;
        }
        for (lVar8 = 0; uVar7 * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
          lVar4 = lVar4 + *(long *)((long)vf->pcmlengths + lVar8 + 8);
          vf->pcm_offset = lVar4;
        }
      }
    }
  }
  if (((iVar3 != 0) && (iVar3 != -3)) || (oVar5 = _get_next_page(vf,&og,-1), oVar5 < 0))
  goto LAB_0018fd23;
  iVar3 = ogg_page_bos(&og);
  if (iVar3 != 0) {
    _decode_clear(vf);
  }
  if (vf->ready_state < 3) goto code_r0x0018fc82;
  goto LAB_0018fd11;
code_r0x0018fc82:
  iVar3 = ogg_page_serialno(&og);
  uVar1 = vf->links;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    if (vf->serialnos[uVar9] == (long)iVar3) {
      uVar7 = uVar9 & 0xffffffff;
      break;
    }
  }
  if ((uint)uVar7 != uVar1) {
    vf->current_link = (uint)uVar7;
    vf->ready_state = 3;
    iVar2 = ogg_page_serialno(&og);
    vf->current_serialno = (long)iVar2;
    ogg_stream_reset_serialno(os,iVar3);
    iVar3 = _make_decode_ready(vf);
    iVar2 = 0;
    if (iVar3 != 0) {
      return iVar3;
    }
LAB_0018fd11:
    ogg_stream_pagein(os,&og);
  }
  goto LAB_0018fb45;
}

Assistant:

int ov_pcm_seek(OggVorbis_File *vf,ogg_int64_t pos){
  int thisblock,lastblock=0;
  int ret=ov_pcm_seek_page(vf,pos);
  if(ret<0)return(ret);
  if((ret=_make_decode_ready(vf)))return ret;

  /* discard leading packets we don't need for the lapping of the
     position we want; don't decode them */

  while(1){
    ogg_packet op;
    ogg_page og;

    int ret=ogg_stream_packetpeek(&vf->os,&op);
    if(ret>0){
      thisblock=vorbis_packet_blocksize(vf->vi+vf->current_link,&op);
      if(thisblock<0){
        ogg_stream_packetout(&vf->os,NULL);
        continue; /* non audio packet */
      }
      if(lastblock)vf->pcm_offset+=(lastblock+thisblock)>>2;

      if(vf->pcm_offset+((thisblock+
                          vorbis_info_blocksize(vf->vi,1))>>2)>=pos)break;

      /* remove the packet from packet queue and track its granulepos */
      ogg_stream_packetout(&vf->os,NULL);
      vorbis_synthesis_trackonly(&vf->vb,&op);  /* set up a vb with
                                                   only tracking, no
                                                   pcm_decode */
      vorbis_synthesis_blockin(&vf->vd,&vf->vb);

      /* end of logical stream case is hard, especially with exact
         length positioning. */

      if(op.granulepos>-1){
        int i;
        /* always believe the stream markers */
        vf->pcm_offset=op.granulepos-vf->pcmlengths[vf->current_link*2];
        if(vf->pcm_offset<0)vf->pcm_offset=0;
        for(i=0;i<vf->current_link;i++)
          vf->pcm_offset+=vf->pcmlengths[i*2+1];
      }

      lastblock=thisblock;

    }else{
      if(ret<0 && ret!=OV_HOLE)break;

      /* suck in a new page */
      if(_get_next_page(vf,&og,-1)<0)break;
      if(ogg_page_bos(&og))_decode_clear(vf);

      if(vf->ready_state<STREAMSET){
        long serialno=ogg_page_serialno(&og);
        int link;

        for(link=0;link<vf->links;link++)
          if(vf->serialnos[link]==serialno)break;
        if(link==vf->links) continue;
        vf->current_link=link;

        vf->ready_state=STREAMSET;
        vf->current_serialno=ogg_page_serialno(&og);
        ogg_stream_reset_serialno(&vf->os,serialno);
        ret=_make_decode_ready(vf);
        if(ret)return ret;
        lastblock=0;
      }

      ogg_stream_pagein(&vf->os,&og);
    }
  }

  vf->bittrack=0.f;
  vf->samptrack=0.f;
  /* discard samples until we reach the desired position. Crossing a
     logical bitstream boundary with abandon is OK. */
  {
    /* note that halfrate could be set differently in each link, but
       vorbisfile encoforces all links are set or unset */
    int hs=vorbis_synthesis_halfrate_p(vf->vi);
    while(vf->pcm_offset<((pos>>hs)<<hs)){
      ogg_int64_t target=(pos-vf->pcm_offset)>>hs;
      long samples=vorbis_synthesis_pcmout(&vf->vd,NULL);

      if(samples>target)samples=target;
      vorbis_synthesis_read(&vf->vd,samples);
      vf->pcm_offset+=samples<<hs;

      if(samples<target)
        if(_fetch_and_process_packet(vf,NULL,1,1)<=0)
          vf->pcm_offset=ov_pcm_total(vf,-1); /* eof */
    }
  }
  return 0;
}